

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix4d>
          (GeomPrimvar *this,double timecode,matrix4d *dest,TimeSampleInterpolationType interp,
          string *err)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  string *args;
  long lVar3;
  double *pdVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  bool bVar5;
  byte bVar6;
  matrix4d value;
  undefined1 local_120 [8];
  string local_118;
  undefined4 local_f4;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  double dStack_90;
  double local_88;
  double local_80;
  double dStack_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  bVar6 = 0;
  local_120 = (undefined1  [8])timecode;
  if (dest == (matrix4d *)0x0) {
joined_r0x001af3e0:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args = err;
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar5 = false;
      }
      else {
        uVar2 = (*pvVar1->type_id)();
        bVar5 = uVar2 == 4;
      }
      if ((bVar5) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001af3e0;
    }
    this_00 = &this->_attr;
    uVar2 = Attribute::type_id(this_00);
    bVar5 = IsSupportedGeomPrimvarType(uVar2);
    if (bVar5) {
      local_b0._0_8_ = (pointer)0x3ff0000000000000;
      local_b0._8_8_ = 0.0;
      local_b0._16_8_ = 0.0;
      local_b0._24_8_ = 0.0;
      dStack_90 = 0.0;
      local_88 = 1.0;
      local_80 = 0.0;
      dStack_78 = 0.0;
      local_70 = 0.0;
      dStack_68 = 0.0;
      local_60 = 1.0;
      local_58 = 0.0;
      dStack_50 = 0.0;
      local_48 = 0.0;
      dStack_40 = 0.0;
      local_38 = 1.0;
      bVar5 = Attribute::get<tinyusdz::value::matrix4d>
                        (this_00,(double)local_120,(matrix4d *)local_b0,interp);
      if (bVar5) {
        pdVar4 = (double *)local_b0;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          dest->m[0][0] = *pdVar4;
          pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
          dest = (matrix4d *)((long)dest + ((ulong)bVar6 * -2 + 1) * 8);
        }
        return bVar5;
      }
      if (err == (string *)0x0) {
        return bVar5;
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_120 + 8),
                 "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                 ,"");
      local_f4 = 0x38;
      Attribute::type_name_abi_cxx11_(&local_d0,this_00);
      fmt::format<double,unsigned_int,std::__cxx11::string>
                (&local_f0,(fmt *)(local_120 + 8),(string *)local_120,(double *)&local_f4,
                 (uint *)&local_d0,in_R9);
      std::__cxx11::string::_M_append((char *)err,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == &local_118.field_2) {
        return bVar5;
      }
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      return bVar5;
    }
    if (err != (string *)0x0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Unsupported type for GeomPrimvar. type = `{}`","");
      Attribute::type_name_abi_cxx11_((string *)(local_120 + 8),this_00);
      fmt::format<std::__cxx11::string>
                ((string *)local_b0,(fmt *)&local_f0,(string *)(local_120 + 8),args);
      std::__cxx11::string::_M_append((char *)err,local_b0._0_8_);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}